

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

optional<slang::ConstantRange> __thiscall
slang::ast::Expression::evalSelector(Expression *this,EvalContext *context)

{
  ExpressionKind EVar1;
  undefined8 uVar2;
  ElementSelectExpression *this_00;
  RangeSelectExpression *this_01;
  MemberAccessExpression *this_02;
  undefined8 extraout_RDX;
  optional<slang::ConstantRange> oVar3;
  undefined1 local_f0;
  ConstantRange local_e8;
  _Storage<slang::ConstantRange,_true> local_e0;
  undefined4 local_d8;
  ConstantValue local_d0;
  undefined4 local_a4;
  _Storage<slang::ConstantRange,_true> local_a0;
  undefined4 local_98;
  ConstantValue local_90;
  bool local_51;
  undefined1 local_50 [7];
  bool unused2;
  ConstantValue unused1;
  EvalContext *context_local;
  Expression *this_local;
  undefined4 local_c;
  
  unused1.value.
  super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ._32_8_ = context;
  slang::ConstantValue::ConstantValue((ConstantValue *)local_50);
  EVar1 = this->kind;
  if (EVar1 == ElementSelect) {
    this_00 = as<slang::ast::ElementSelectExpression>(this);
    uVar2 = unused1.value.
            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ._32_8_;
    slang::ConstantValue::ConstantValue(&local_90,(nullptr_t)0x0);
    oVar3 = ElementSelectExpression::evalIndex
                      (this_00,(EvalContext *)uVar2,&local_90,(ConstantValue *)local_50,&local_51);
    local_a0 = oVar3.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ConstantRange>._M_payload;
    local_98 = CONCAT31(local_98._1_3_,
                        oVar3.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                        super__Optional_payload_base<slang::ConstantRange>._M_engaged);
    local_c = local_98;
    unique0x100001ba = local_a0;
    slang::ConstantValue::~ConstantValue(&local_90);
  }
  else if (EVar1 == RangeSelect) {
    this_01 = as<slang::ast::RangeSelectExpression>(this);
    uVar2 = unused1.value.
            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ._32_8_;
    slang::ConstantValue::ConstantValue(&local_d0,(nullptr_t)0x0);
    oVar3 = RangeSelectExpression::evalRange(this_01,(EvalContext *)uVar2,&local_d0);
    local_e0 = oVar3.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ConstantRange>._M_payload;
    local_d8 = CONCAT31(local_d8._1_3_,
                        oVar3.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                        super__Optional_payload_base<slang::ConstantRange>._M_engaged);
    local_c = local_d8;
    unique0x100001c2 = local_e0;
    slang::ConstantValue::~ConstantValue(&local_d0);
  }
  else if (EVar1 == MemberAccess) {
    this_02 = as<slang::ast::MemberAccessExpression>(this);
    local_e8 = MemberAccessExpression::getSelectRange(this_02);
    std::optional<slang::ConstantRange>::optional<slang::ConstantRange,_true>
              ((optional<slang::ConstantRange> *)((long)&this_local + 4),&local_e8);
  }
  else {
    std::optional<slang::ConstantRange>::optional
              ((optional<slang::ConstantRange> *)((long)&this_local + 4));
  }
  local_a4 = 1;
  slang::ConstantValue::~ConstantValue((ConstantValue *)local_50);
  local_f0 = (undefined1)local_c;
  oVar3.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ConstantRange>._8_4_ =
       (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),local_f0);
  oVar3.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ConstantRange>._M_payload = stack0xffffffffffffffec;
  return (optional<slang::ConstantRange>)
         oVar3.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::ConstantRange>;
}

Assistant:

std::optional<ConstantRange> Expression::evalSelector(EvalContext& context) const {
    ConstantValue unused1;
    bool unused2;
    switch (kind) {
        case ExpressionKind::ElementSelect:
            return as<ElementSelectExpression>().evalIndex(context, nullptr, unused1, unused2);
        case ExpressionKind::RangeSelect:
            return as<RangeSelectExpression>().evalRange(context, nullptr);
        case ExpressionKind::MemberAccess:
            return as<MemberAccessExpression>().getSelectRange();
        default:
            return {};
    }
}